

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

void __thiscall
TPZFMatrix<long_double>::TPZFMatrix
          (TPZFMatrix<long_double> *this,void **vtt,int64_t rows,int64_t columns)

{
  longdouble *plVar1;
  ulong uVar2;
  
  TPZMatrix<long_double>::TPZMatrix(&this->super_TPZMatrix<long_double>,vtt + 1,rows,columns);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)*vtt;
  this->fElem = (longdouble *)0x0;
  this->fGiven = (longdouble *)0x0;
  this->fSize = 0;
  TPZManVector<int,_5>::TPZManVector(&this->fPivot,0);
  (this->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016491a8;
  (this->fWork).fNAlloc = 0;
  (this->fWork).fStore = (longdouble *)0x0;
  (this->fWork).fNElements = 0;
  uVar2 = columns * rows;
  if (uVar2 != 0) {
    plVar1 = (longdouble *)operator_new__(-(ulong)(uVar2 >> 0x3c != 0) | uVar2 * 0x10);
    this->fElem = plVar1;
  }
  return;
}

Assistant:

explicit inline  TPZFMatrix(const int64_t rows ,const int64_t columns = 1) : 
    TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId),
    TPZMatrix<TVar>(rows,columns), fElem(0),fGiven(0),fSize(0) {
        if(rows*columns) fElem = new TVar[rows*columns];
    }